

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfid.cpp
# Opt level: O2

void checkOptions(Options *opts,int argc,char **argv)

{
  bool bVar1;
  int iVar2;
  ostream *poVar3;
  char *pcVar4;
  allocator local_5a;
  allocator local_59;
  string local_58;
  string local_38;
  
  std::__cxx11::string::string((string *)&local_58,"author=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"author of program",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"version=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"compilation info",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"example=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"example usages",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"h|help=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"short description",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"t|track=i:-1",&local_59);
  std::__cxx11::string::string((string *)&local_38,"which track to extract",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"r|raw=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"print noteon deltas",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"f|file=b",&local_59);
  std::__cxx11::string::string((string *)&local_38,"display filename",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"max=i:100000",&local_59);
  std::__cxx11::string::string
            ((string *)&local_38,"maximum number of notes expected in input",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  std::__cxx11::string::string((string *)&local_58,"debug=b",&local_59);
  std::__cxx11::string::string
            ((string *)&local_38,"debug mode to find errors in input file",&local_5a);
  smf::Options::define(opts,&local_58,&local_38);
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  smf::Options::process(opts,argc,argv,1,0);
  std::__cxx11::string::string((string *)&local_58,"author",(allocator *)&local_38);
  bVar1 = smf::Options::getBoolean(opts,&local_58);
  std::__cxx11::string::~string((string *)&local_58);
  if (bVar1) {
    poVar3 = std::operator<<((ostream *)&std::cout,"Written by Craig Stuart Sapp, ");
    pcVar4 = "craig@ccrma.stanford.edu, 18 Jun 2002";
  }
  else {
    std::__cxx11::string::string((string *)&local_58,"version",(allocator *)&local_38);
    bVar1 = smf::Options::getBoolean(opts,&local_58);
    std::__cxx11::string::~string((string *)&local_58);
    if (!bVar1) {
      std::__cxx11::string::string((string *)&local_58,"help",(allocator *)&local_38);
      bVar1 = smf::Options::getBoolean(opts,&local_58);
      std::__cxx11::string::~string((string *)&local_58);
      if (bVar1) {
        smf::Options::getCommand_abi_cxx11_(&local_58,opts);
        std::__cxx11::string::~string((string *)&local_58);
      }
      else {
        std::__cxx11::string::string((string *)&local_58,"example",(allocator *)&local_38);
        bVar1 = smf::Options::getBoolean(opts,&local_58);
        std::__cxx11::string::~string((string *)&local_58);
        if (!bVar1) {
          std::__cxx11::string::string((string *)&local_58,"track",(allocator *)&local_38);
          track = smf::Options::getInteger(opts,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::string((string *)&local_58,"debug",(allocator *)&local_38);
          bVar1 = smf::Options::getBoolean(opts,&local_58);
          debugQ = (int)bVar1;
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::string((string *)&local_58,"max",(allocator *)&local_38);
          maxcount = smf::Options::getInteger(opts,&local_58);
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::string((string *)&local_58,"raw",(allocator *)&local_38);
          bVar1 = smf::Options::getBoolean(opts,&local_58);
          rawQ = (int)bVar1;
          std::__cxx11::string::~string((string *)&local_58);
          std::__cxx11::string::string((string *)&local_58,"file",(allocator *)&local_38);
          bVar1 = smf::Options::getBoolean(opts,&local_58);
          fileQ = (int)bVar1;
          std::__cxx11::string::~string((string *)&local_58);
          iVar2 = smf::Options::getArgCount(opts);
          if (iVar2 == 1) {
            return;
          }
          smf::Options::getCommand_abi_cxx11_(&local_58,opts);
          std::__cxx11::string::~string((string *)&local_58);
          exit(1);
        }
      }
      goto LAB_00116f46;
    }
    poVar3 = std::operator<<((ostream *)&std::cout,*argv);
    poVar3 = std::operator<<(poVar3,", version: 18 Jun 2002");
    std::endl<char,std::char_traits<char>>(poVar3);
    poVar3 = std::operator<<((ostream *)&std::cout,"compiled: ");
    pcVar4 = "Apr 26 2025";
  }
  poVar3 = std::operator<<(poVar3,pcVar4);
  std::endl<char,std::char_traits<char>>(poVar3);
LAB_00116f46:
  exit(0);
}

Assistant:

void checkOptions(Options& opts, int argc, char* argv[]) {
	opts.define("author=b",  "author of program");
	opts.define("version=b", "compilation info");
	opts.define("example=b", "example usages");
	opts.define("h|help=b",  "short description");

	opts.define("t|track=i:-1", "which track to extract");
	opts.define("r|raw=b",      "print noteon deltas");
	opts.define("f|file=b",      "display filename");
	opts.define("max=i:100000", "maximum number of notes expected in input");
	opts.define("debug=b",  "debug mode to find errors in input file");

	opts.process(argc, argv);

	// handle basic options:
	if (opts.getBoolean("author")) {
		cout << "Written by Craig Stuart Sapp, "
			  << "craig@ccrma.stanford.edu, 18 Jun 2002" << endl;
		exit(0);
	} else if (opts.getBoolean("version")) {
		cout << argv[0] << ", version: 18 Jun 2002" << endl;
		cout << "compiled: " << __DATE__ << endl;
		exit(0);
	} else if (opts.getBoolean("help")) {
		usage(opts.getCommand().c_str());
		exit(0);
	} else if (opts.getBoolean("example")) {
		example();
		exit(0);
	}

	track    = opts.getInteger("track");
	debugQ   = opts.getBoolean("debug");
	maxcount = opts.getInteger("max");
	rawQ     = opts.getBoolean("raw");
	fileQ    = opts.getBoolean("file");

	if (opts.getArgCount() != 1) {
		usage(opts.getCommand().c_str());
		exit(1);
	}
}